

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_services.c
# Opt level: O0

int csp_get_buf_free(uint16_t node,uint32_t timeout,uint32_t *size)

{
  int iVar1;
  __uint32_t _Var2;
  __uint32_t *in_RDX;
  void *unaff_retaddr;
  int in_stack_00000008;
  uint32_t in_stack_00000010;
  int status;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint16_t in_stack_fffffffffffffff0;
  uint8_t in_stack_fffffffffffffff3;
  undefined4 local_4;
  
  iVar1 = csp_transaction_w_opts
                    (in_stack_fffffffffffffff3,in_stack_fffffffffffffff0,
                     (uint8_t)((ulong)in_RDX >> 0x38),(uint32_t)in_RDX,
                     (void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc,unaff_retaddr,in_stack_00000008,in_stack_00000010);
  if (iVar1 == 4) {
    _Var2 = __bswap_32(*in_RDX);
    *in_RDX = _Var2;
    local_4 = 0;
  }
  else {
    *in_RDX = 0;
    local_4 = -3;
  }
  return local_4;
}

Assistant:

int csp_get_buf_free(uint16_t node, uint32_t timeout, uint32_t * size) {

	int status = csp_transaction_w_opts(CSP_PRIO_NORM, node, CSP_BUF_FREE, timeout, NULL, 0, size, sizeof(*size), CSP_O_CRC32);
	if (status == sizeof(*size)) {
		*size = be32toh(*size);
		return CSP_ERR_NONE;
	}
	*size = 0;
	return CSP_ERR_TIMEDOUT;
}